

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrinsic_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::ExtrinsicGeometryInterface::unrequireVertexMaxPrincipalCurvatures
          (ExtrinsicGeometryInterface *this)

{
  int iVar1;
  logic_error *this_00;
  
  iVar1 = (this->vertexMaxPrincipalCurvaturesQ).super_DependentQuantity.requireCount;
  (this->vertexMaxPrincipalCurvaturesQ).super_DependentQuantity.requireCount = iVar1 + -1;
  if (0 < iVar1) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error
            (this_00,"Quantity was unrequire()\'d more than than it was require()\'d");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

void ExtrinsicGeometryInterface::computeVertexMeanCurvatures() {
  edgeLengthsQ.ensureHave();
  edgeDihedralAnglesQ.ensureHave();

  vertexMeanCurvatures = VertexData<double>(mesh);

  // Here we use the Steiner approximation of mean curvature: if we
  // imagine each edge is an arc of a small cylinder connecting the
  // two adjacent faces, and let the radius of this cylinder go to
  // zero, then the mean curvature is one half the dihedral angle
  // times the edge length.
  for (Vertex v : mesh.vertices()) {
    double meanCurvature = 0.;
    for (Halfedge he : v.outgoingHalfedges()) {
      double len = edgeLengths[he.edge()];
      double alpha = edgeDihedralAngles[he.edge()];
      meanCurvature += alpha * len / 2.;
    }

    // Since each edge is shared by two vertices, we give half of
    // the curvature to each vertex (equivalently, we integrate
    // curvature over a dual cell associated with the vertex).
    // The resulting vertex curvatures are equal to 1 for a unit sphere.
    vertexMeanCurvatures[v] = meanCurvature / 2.;
  }
}